

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Loop::AreAllOperandsOutsideLoop(Loop *this,Instruction *inst)

{
  bool bVar1;
  IRContext *this_00;
  anon_class_16_2_4fac6b53 local_50;
  undefined1 local_40 [8];
  function<bool_(const_unsigned_int_*)> operand_outside_loop;
  DefUseManager *def_use_mgr;
  Instruction *inst_local;
  Loop *this_local;
  
  this_00 = GetContext(this);
  operand_outside_loop._M_invoker = (_Invoker_type)IRContext::get_def_use_mgr(this_00);
  local_50.def_use_mgr = (DefUseManager **)&operand_outside_loop._M_invoker;
  local_50.this = this;
  std::function<bool(unsigned_int_const*)>::
  function<spvtools::opt::Loop::AreAllOperandsOutsideLoop(spvtools::opt::Instruction_const&)const::__0,void>
            ((function<bool(unsigned_int_const*)> *)local_40,&local_50);
  bVar1 = Instruction::WhileEachInId(inst,(function<bool_(const_unsigned_int_*)> *)local_40);
  std::function<bool_(const_unsigned_int_*)>::~function
            ((function<bool_(const_unsigned_int_*)> *)local_40);
  return bVar1;
}

Assistant:

bool Loop::AreAllOperandsOutsideLoop(const Instruction& inst) const {
  analysis::DefUseManager* def_use_mgr = GetContext()->get_def_use_mgr();

  const std::function<bool(const uint32_t*)> operand_outside_loop =
      [this, &def_use_mgr](const uint32_t* id) {
        return !this->IsInsideLoop(def_use_mgr->GetDef(*id));
      };

  return inst.WhileEachInId(operand_outside_loop);
}